

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O1

void __thiscall
cmTryRunCommand::DoNotRunExecutable
          (cmTryRunCommand *this,string *runArgs,string *srcFile,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  char *pcVar5;
  cmState *pcVar6;
  long *plVar7;
  char *__s;
  ostream *poVar8;
  size_t sVar9;
  size_type *psVar10;
  _Ios_Openmode _Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string errorMessage;
  string internalRunOutputName;
  string copyDest;
  string detailsString;
  string resultFileName;
  string comment;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  long *local_280 [2];
  long local_270 [2];
  long *local_260 [2];
  long local_250 [2];
  string *local_240;
  string *local_238;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_238 = srcFile;
  psVar4 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,pcVar2,pcVar2 + psVar4->_M_string_length);
  std::__cxx11::string::append((char *)&local_2a0);
  std::__cxx11::string::append((char *)&local_2a0);
  psVar4 = &(this->super_cmCoreTryCompile).OutputFile;
  cmsys::SystemTools::GetFilenameWithoutExtension((string *)local_230,psVar4);
  std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_230);
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)&local_2a0);
  std::__cxx11::string::_M_append
            ((char *)&local_2a0,(ulong)(this->RunResultVariable)._M_dataplus._M_p);
  cmsys::SystemTools::GetFilenameExtension((string *)local_230,psVar4);
  std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_230);
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  cmsys::SystemTools::CopyFileAlways(psVar4,&local_2a0);
  psVar4 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
  local_260[0] = local_250;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_260,pcVar2,pcVar2 + psVar4->_M_string_length);
  std::__cxx11::string::append((char *)local_260);
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"For details see ","");
  std::__cxx11::string::_M_append((char *)local_280,(ulong)local_260[0]);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  pcVar2 = (this->RunResultVariable)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e0,pcVar2,pcVar2 + (this->RunResultVariable)._M_string_length);
  local_240 = runArgs;
  std::__cxx11::string::append((char *)&local_2e0);
  psVar4 = &this->RunResultVariable;
  pcVar5 = cmMakefile::GetDefinition((this->super_cmCoreTryCompile).super_cmCommand.Makefile,psVar4)
  ;
  if (pcVar5 == (char *)0x0) {
    local_228 = 0;
    local_220._M_local_buf[0] = '\0';
    local_230 = (undefined1  [8])&local_220;
    std::__cxx11::string::append(local_230);
    std::__cxx11::string::_M_append(local_230,(ulong)local_280[0]);
    cmMakefile::AddCacheDefinition
              ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,psVar4,
               "PLEASE_FILL_OUT-FAILED_TO_RUN",(char *)local_230,STRING,false);
    pcVar6 = cmMakefile::GetState((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
    pcVar5 = cmState::GetCacheEntryValue(pcVar6,psVar4);
    if (pcVar5 != (char *)0x0) {
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"ADVANCED","");
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"1","");
      cmState::SetCacheEntryProperty(pcVar6,psVar4,&local_300,&local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,
                      CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1)
      ;
    }
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  if ((out != (string *)0x0) &&
     (pcVar5 = cmMakefile::GetDefinition
                         ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&local_2e0),
     pcVar5 == (char *)0x0)) {
    local_228 = 0;
    local_220._M_local_buf[0] = '\0';
    local_230 = (undefined1  [8])&local_220;
    std::__cxx11::string::append(local_230);
    std::__cxx11::string::_M_append(local_230,(ulong)local_280[0]);
    cmMakefile::AddCacheDefinition
              ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&local_2e0,
               "PLEASE_FILL_OUT-NOTFOUND",(char *)local_230,STRING,false);
    pcVar6 = cmMakefile::GetState((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
    pcVar5 = cmState::GetCacheEntryValue(pcVar6,&local_2e0);
    if (pcVar5 != (char *)0x0) {
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"ADVANCED","");
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"1","");
      cmState::SetCacheEntryProperty(pcVar6,&local_2e0,&local_300,&local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,
                      CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1)
      ;
    }
    bVar3 = true;
  }
  if (bVar3) {
    _Var11 = _S_out;
    if (DoNotRunExecutable(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
        ::firstTryRun != '\0') {
      _Var11 = _S_app;
    }
    std::ofstream::ofstream(local_230,(char *)local_260[0],_Var11);
    if ((abStack_210[*(long *)((long)local_230 + -0x18)] & 5) == 0) {
      if (DoNotRunExecutable(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
          ::firstTryRun == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_230,
                   "# This file was generated by CMake because it detected TRY_RUN() commands\n# in crosscompiling mode. It will be overwritten by the next CMake run.\n# Copy it to a safe location, set the variables to appropriate values\n# and use it then to preset the CMake cache (using -C).\n\n"
                   ,0x111);
      }
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"\n","");
      std::__cxx11::string::_M_append
                ((char *)&local_300,(ulong)(this->RunResultVariable)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_300);
      std::__cxx11::string::_M_append
                ((char *)&local_300,(ulong)(this->RunResultVariable)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_300);
      if (out != (string *)0x0) {
        std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2e0._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_300);
        std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2e0._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_300);
      }
      std::__cxx11::string::append((char *)&local_300);
      std::__cxx11::string::_M_append
                ((char *)&local_300,(ulong)(this->CompileResultVariable)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_300);
      paVar1 = &local_320.field_2;
      pcVar2 = (local_238->_M_dataplus)._M_p;
      local_320._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_320,pcVar2,pcVar2 + local_238->_M_string_length);
      std::__cxx11::string::append((char *)&local_320);
      std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_320._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar1) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_300);
      local_320._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_320,local_2a0._M_dataplus._M_p,
                 local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
      std::__cxx11::string::append((char *)&local_320);
      std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_320._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar1) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_300);
      std::__cxx11::string::_M_append((char *)&local_300,(ulong)(local_240->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_300);
      cmMakefile::FormatListFileStack_abi_cxx11_
                (&local_2c0,(this->super_cmCoreTryCompile).super_cmCommand.Makefile);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,0x4af0bd);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_320.field_2._M_allocated_capacity = *psVar10;
        local_320.field_2._8_8_ = plVar7[3];
        local_320._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_320.field_2._M_allocated_capacity = *psVar10;
        local_320._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_320._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_320._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar1) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::ReplaceString(&local_300,"\n","\n# ");
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,local_300._M_dataplus._M_p,local_300._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"set( ",5);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(this->RunResultVariable)._M_dataplus._M_p,
                          (this->RunResultVariable)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," \n     \"",8);
      pcVar5 = cmMakefile::GetDefinition
                         ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,psVar4);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
      }
      else {
        sVar9 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\"\n     CACHE STRING \"Result from TRY_RUN\" FORCE)\n\n",0x32);
      if (out != (string *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"set( ",5);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_2e0._M_dataplus._M_p,
                            local_2e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," \n     \"",8);
        pcVar5 = cmMakefile::GetDefinition
                           ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&local_2e0);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
        }
        else {
          sVar9 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\"\n     CACHE STRING \"Output from TRY_RUN\" FORCE)\n\n",0x32);
      }
      std::ofstream::close();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
    }
    DoNotRunExecutable(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
    ::firstTryRun = '\x01';
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_300,
               "TRY_RUN() invoked in cross-compiling mode, please set the following cache variables appropriately:\n"
               ,"");
    std::operator+(&local_2c0,"   ",psVar4);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c0);
    paVar1 = &local_320.field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_320.field_2._M_allocated_capacity = *psVar10;
      local_320.field_2._8_8_ = plVar7[3];
      local_320._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_320.field_2._M_allocated_capacity = *psVar10;
      local_320._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_320._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_320._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar1) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (out != (string *)0x0) {
      std::operator+(&local_2c0,"   ",&local_2e0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c0);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_320.field_2._M_allocated_capacity = *psVar10;
        local_320.field_2._8_8_ = plVar7[3];
        local_320._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_320.field_2._M_allocated_capacity = *psVar10;
        local_320._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_320._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_320._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar1) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_280[0]);
    cmSystemTools::Error(&local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
  }
  else if (out != (string *)0x0) {
    __s = cmMakefile::GetDefinition
                    ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&local_2e0);
    pcVar5 = (char *)out->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)out,0,pcVar5,(ulong)__s);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_280[0] != local_270) {
    operator_delete(local_280[0],local_270[0] + 1);
  }
  if (local_260[0] != local_250) {
    operator_delete(local_260[0],local_250[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTryRunCommand::DoNotRunExecutable(const std::string& runArgs,
                                         const std::string& srcFile,
                                         std::string* out)
{
  // copy the executable out of the CMakeFiles/ directory, so it is not
  // removed at the end of TRY_RUN and the user can run it manually
  // on the target platform.
  std::string copyDest = this->Makefile->GetHomeOutputDirectory();
  copyDest += "/CMakeFiles";
  copyDest += "/";
  copyDest += cmSystemTools::GetFilenameWithoutExtension(this->OutputFile);
  copyDest += "-";
  copyDest += this->RunResultVariable;
  copyDest += cmSystemTools::GetFilenameExtension(this->OutputFile);
  cmSystemTools::CopyFileAlways(this->OutputFile, copyDest);

  std::string resultFileName = this->Makefile->GetHomeOutputDirectory();
  resultFileName += "/TryRunResults.cmake";

  std::string detailsString = "For details see ";
  detailsString += resultFileName;

  std::string internalRunOutputName =
    this->RunResultVariable + "__TRYRUN_OUTPUT";
  bool error = false;

  if (this->Makefile->GetDefinition(this->RunResultVariable) == nullptr) {
    // if the variables doesn't exist, create it with a helpful error text
    // and mark it as advanced
    std::string comment;
    comment += "Run result of TRY_RUN(), indicates whether the executable "
               "would have been able to run on its target platform.\n";
    comment += detailsString;
    this->Makefile->AddCacheDefinition(this->RunResultVariable,
                                       "PLEASE_FILL_OUT-FAILED_TO_RUN",
                                       comment.c_str(), cmStateEnums::STRING);

    cmState* state = this->Makefile->GetState();
    const char* existingValue =
      state->GetCacheEntryValue(this->RunResultVariable);
    if (existingValue) {
      state->SetCacheEntryProperty(this->RunResultVariable, "ADVANCED", "1");
    }

    error = true;
  }

  // is the output from the executable used ?
  if (out != nullptr) {
    if (this->Makefile->GetDefinition(internalRunOutputName) == nullptr) {
      // if the variables doesn't exist, create it with a helpful error text
      // and mark it as advanced
      std::string comment;
      comment +=
        "Output of TRY_RUN(), contains the text, which the executable "
        "would have printed on stdout and stderr on its target platform.\n";
      comment += detailsString;

      this->Makefile->AddCacheDefinition(
        internalRunOutputName, "PLEASE_FILL_OUT-NOTFOUND", comment.c_str(),
        cmStateEnums::STRING);
      cmState* state = this->Makefile->GetState();
      const char* existing = state->GetCacheEntryValue(internalRunOutputName);
      if (existing) {
        state->SetCacheEntryProperty(internalRunOutputName, "ADVANCED", "1");
      }

      error = true;
    }
  }

  if (error) {
    static bool firstTryRun = true;
    cmsys::ofstream file(resultFileName.c_str(),
                         firstTryRun ? std::ios::out : std::ios::app);
    if (file) {
      if (firstTryRun) {
        /* clang-format off */
        file << "# This file was generated by CMake because it detected "
                "TRY_RUN() commands\n"
                "# in crosscompiling mode. It will be overwritten by the next "
                "CMake run.\n"
                "# Copy it to a safe location, set the variables to "
                "appropriate values\n"
                "# and use it then to preset the CMake cache (using -C).\n\n";
        /* clang-format on */
      }

      std::string comment = "\n";
      comment += this->RunResultVariable;
      comment += "\n   indicates whether the executable would have been able "
                 "to run on its\n"
                 "   target platform. If so, set ";
      comment += this->RunResultVariable;
      comment += " to\n"
                 "   the exit code (in many cases 0 for success), otherwise "
                 "enter \"FAILED_TO_RUN\".\n";
      if (out != nullptr) {
        comment += internalRunOutputName;
        comment +=
          "\n   contains the text the executable "
          "would have printed on stdout and stderr.\n"
          "   If the executable would not have been able to run, set ";
        comment += internalRunOutputName;
        comment += " empty.\n"
                   "   Otherwise check if the output is evaluated by the "
                   "calling CMake code. If so,\n"
                   "   check what the source file would have printed when "
                   "called with the given arguments.\n";
      }
      comment += "The ";
      comment += this->CompileResultVariable;
      comment += " variable holds the build result for this TRY_RUN().\n\n"
                 "Source file   : ";
      comment += srcFile + "\n";
      comment += "Executable    : ";
      comment += copyDest + "\n";
      comment += "Run arguments : ";
      comment += runArgs;
      comment += "\n";
      comment += "   Called from: " + this->Makefile->FormatListFileStack();
      cmsys::SystemTools::ReplaceString(comment, "\n", "\n# ");
      file << comment << "\n\n";

      file << "set( " << this->RunResultVariable << " \n     \""
           << this->Makefile->GetDefinition(this->RunResultVariable)
           << "\"\n     CACHE STRING \"Result from TRY_RUN\" FORCE)\n\n";

      if (out != nullptr) {
        file << "set( " << internalRunOutputName << " \n     \""
             << this->Makefile->GetDefinition(internalRunOutputName)
             << "\"\n     CACHE STRING \"Output from TRY_RUN\" FORCE)\n\n";
      }
      file.close();
    }
    firstTryRun = false;

    std::string errorMessage = "TRY_RUN() invoked in cross-compiling mode, "
                               "please set the following cache variables "
                               "appropriately:\n";
    errorMessage += "   " + this->RunResultVariable + " (advanced)\n";
    if (out != nullptr) {
      errorMessage += "   " + internalRunOutputName + " (advanced)\n";
    }
    errorMessage += detailsString;
    cmSystemTools::Error(errorMessage);
    return;
  }

  if (out != nullptr) {
    (*out) = this->Makefile->GetDefinition(internalRunOutputName);
  }
}